

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

void init_race_probs(void)

{
  long lVar1;
  int *piVar2;
  void *p;
  void *p_00;
  void *p_01;
  void *pvVar3;
  char *pcVar4;
  level_conflict *plVar5;
  int local_70;
  player_race *ppStack_68;
  wchar_t hometown;
  player_race *p_race;
  level_conflict *plStack_58;
  wchar_t prob;
  level *west;
  level *south;
  level *east;
  level *north;
  level *lev;
  int **temp_path;
  int **lev_path;
  int **adjacency;
  wchar_t n;
  wchar_t k;
  wchar_t j;
  wchar_t i;
  
  race_prob = (int **)mem_zalloc((ulong)z_info->p_race_max << 3);
  for (k = L'\0'; k < (int)(uint)z_info->p_race_max; k = k + L'\x01') {
    piVar2 = (int *)mem_zalloc((long)world->num_levels << 2);
    race_prob[k] = piVar2;
  }
  p = mem_zalloc((long)world->num_levels << 3);
  p_00 = mem_zalloc((long)world->num_levels << 3);
  p_01 = mem_zalloc((long)world->num_levels << 3);
  for (k = L'\0'; k < world->num_levels; k = k + L'\x01') {
    pvVar3 = mem_zalloc((long)world->num_levels << 2);
    *(void **)((long)p + (long)k * 8) = pvVar3;
    pvVar3 = mem_zalloc((long)world->num_levels << 2);
    *(void **)((long)p_00 + (long)k * 8) = pvVar3;
    pvVar3 = mem_zalloc((long)world->num_levels << 2);
    *(void **)((long)p_01 + (long)k * 8) = pvVar3;
  }
  for (k = L'\0'; k < world->num_levels; k = k + L'\x01') {
    plVar5 = world->levels;
    east = (level *)0x0;
    south = (level *)0x0;
    west = (level *)0x0;
    plStack_58 = (level_conflict *)0x0;
    if (plVar5[k].north != (char *)0x0) {
      east = (level *)level_by_name(world,plVar5[k].north);
    }
    if (plVar5[k].east != (char *)0x0) {
      south = (level *)level_by_name(world,plVar5[k].east);
    }
    if (plVar5[k].south != (char *)0x0) {
      west = (level *)level_by_name(world,plVar5[k].south);
    }
    if (plVar5[k].west != (char *)0x0) {
      plStack_58 = level_by_name(world,plVar5[k].west);
    }
    for (adjacency._4_4_ = 0; adjacency._4_4_ < world->num_levels;
        adjacency._4_4_ = adjacency._4_4_ + 1) {
      *(undefined4 *)(*(long *)((long)p + (long)k * 8) + (long)adjacency._4_4_ * 4) = 0;
      *(undefined4 *)(*(long *)((long)p_00 + (long)k * 8) + (long)adjacency._4_4_ * 4) = 0;
      *(undefined4 *)(*(long *)((long)p_01 + (long)k * 8) + (long)adjacency._4_4_ * 4) = 0;
    }
    if (east != (level *)0x0) {
      *(undefined4 *)(*(long *)((long)p + (long)k * 8) + (long)east->index * 4) = 1;
      *(undefined4 *)(*(long *)((long)p_01 + (long)k * 8) + (long)east->index * 4) = 1;
    }
    if (south != (level *)0x0) {
      *(undefined4 *)(*(long *)((long)p + (long)k * 8) + (long)south->index * 4) = 1;
      *(undefined4 *)(*(long *)((long)p_01 + (long)k * 8) + (long)south->index * 4) = 1;
    }
    if (west != (level *)0x0) {
      *(undefined4 *)(*(long *)((long)p + (long)k * 8) + (long)west->index * 4) = 1;
      *(undefined4 *)(*(long *)((long)p_01 + (long)k * 8) + (long)west->index * 4) = 1;
    }
    if (plStack_58 != (level_conflict *)0x0) {
      *(undefined4 *)(*(long *)((long)p + (long)k * 8) + (long)plStack_58->index * 4) = 1;
      *(undefined4 *)(*(long *)((long)p_01 + (long)k * 8) + (long)plStack_58->index * 4) = 1;
    }
  }
  for (adjacency._0_4_ = 0; (int)adjacency < 3; adjacency._0_4_ = (int)adjacency + 1) {
    for (k = L'\0'; k < world->num_levels; k = k + L'\x01') {
      for (n = L'\0'; n < world->num_levels; n = n + L'\x01') {
        *(undefined4 *)(*(long *)((long)p_00 + (long)k * 8) + (long)n * 4) = 0;
        for (adjacency._4_4_ = 0; adjacency._4_4_ < world->num_levels;
            adjacency._4_4_ = adjacency._4_4_ + 1) {
          lVar1 = *(long *)((long)p_00 + (long)k * 8);
          *(int *)(lVar1 + (long)n * 4) =
               *(int *)(*(long *)((long)p_01 + (long)k * 8) + (long)adjacency._4_4_ * 4) *
               *(int *)(*(long *)((long)p_01 + (long)adjacency._4_4_ * 8) + (long)n * 4) +
               *(int *)(lVar1 + (long)n * 4);
        }
      }
    }
    for (k = L'\0'; k < world->num_levels; k = k + L'\x01') {
      for (n = L'\0'; n < world->num_levels; n = n + L'\x01') {
        *(undefined4 *)(*(long *)((long)p_01 + (long)k * 8) + (long)n * 4) =
             *(undefined4 *)(*(long *)((long)p_00 + (long)k * 8) + (long)n * 4);
      }
    }
  }
  for (k = L'\0'; k < world->num_levels; k = k + L'\x01') {
    for (n = L'\0'; n < world->num_levels; n = n + L'\x01') {
      *(undefined4 *)(*(long *)((long)p_00 + (long)k * 8) + (long)n * 4) = 0;
      for (adjacency._4_4_ = 0; adjacency._4_4_ < world->num_levels;
          adjacency._4_4_ = adjacency._4_4_ + 1) {
        lVar1 = *(long *)((long)p_00 + (long)k * 8);
        *(int *)(lVar1 + (long)n * 4) =
             *(int *)(*(long *)((long)p_01 + (long)k * 8) + (long)adjacency._4_4_ * 4) *
             *(int *)(*(long *)((long)p + (long)adjacency._4_4_ * 8) + (long)n * 4) +
             *(int *)(lVar1 + (long)n * 4);
      }
      if (*(int *)(*(long *)((long)p_00 + (long)k * 8) + (long)n * 4) <
          *(int *)(*(long *)((long)p_01 + (long)k * 8) + (long)n * 4)) {
        *(undefined4 *)(*(long *)((long)p_00 + (long)k * 8) + (long)n * 4) =
             *(undefined4 *)(*(long *)((long)p_01 + (long)k * 8) + (long)n * 4);
      }
    }
  }
  for (k = L'\0'; k < world->num_levels; k = k + L'\x01') {
    p_race._4_4_ = 0;
    for (ppStack_68 = races; ppStack_68 != (player_race *)0x0; ppStack_68 = ppStack_68->next) {
      pcVar4 = strstr(world->name,"Dungeon");
      if (pcVar4 == (char *)0x0) {
        plVar5 = level_by_name(world,ppStack_68->hometown);
        local_70 = plVar5->index;
      }
      else {
        local_70 = 1;
      }
      p_race._4_4_ = *(int *)(*(long *)((long)p_00 + (long)world->levels[local_70].index * 8) +
                             (long)k * 4) + 1 + p_race._4_4_;
      race_prob[ppStack_68->ridx][k] = p_race._4_4_;
    }
  }
  for (k = L'\0'; k < world->num_levels; k = k + L'\x01') {
    mem_free(*(void **)((long)p_01 + (long)k * 8));
    mem_free(*(void **)((long)p + (long)k * 8));
    mem_free(*(void **)((long)p_00 + (long)k * 8));
  }
  mem_free(p_01);
  mem_free(p);
  mem_free(p_00);
  return;
}

Assistant:

void init_race_probs(void)
{
	int i, j, k, n;
	int **adjacency, **lev_path, **temp_path;

	/* Make the array */
	race_prob = mem_zalloc(z_info->p_race_max * sizeof(int*));
	for (i = 0; i < z_info->p_race_max; i++) {
		race_prob[i] = mem_zalloc(world->num_levels * sizeof(int));
	}

	/* Prepare temporary adjacency arrays */
	adjacency = mem_zalloc(world->num_levels * sizeof(int*));
	lev_path = mem_zalloc(world->num_levels * sizeof(int*));
	temp_path = mem_zalloc(world->num_levels * sizeof(int*));
	for (i = 0; i < world->num_levels; i++) {
		adjacency[i] = mem_zalloc(world->num_levels * sizeof(int));
		lev_path[i] = mem_zalloc(world->num_levels * sizeof(int));
		temp_path[i] = mem_zalloc(world->num_levels * sizeof(int));
	}

	/* Make the adjacency matrix */
	for (i = 0; i < world->num_levels; i++) {
		/* Get the horizontally adjacent levels */
		struct level *lev = &world->levels[i];
		struct level *north = NULL;
		struct level *east = NULL;
		struct level *south = NULL;
		struct level *west = NULL;
		if (lev->north) north = level_by_name(world, lev->north);
		if (lev->east) east = level_by_name(world, lev->east);
		if (lev->south) south = level_by_name(world, lev->south);
		if (lev->west) west = level_by_name(world, lev->west);

		/* Initialise this row */
		for (k = 0; k < world->num_levels; k++) {
			adjacency[i][k] = 0;
			lev_path[i][k] = 0;
			temp_path[i][k] = 0;
		}

		/* Add 1s where there's an adjacent stage (not up or down) */
		if (north) {
			adjacency[i][north->index] = 1;
			temp_path[i][north->index] = 1;
		}
		if (east) {
			adjacency[i][east->index] = 1;
			temp_path[i][east->index] = 1;
		}
		if (south) {
			adjacency[i][south->index] = 1;
			temp_path[i][south->index] = 1;
		}
		if (west) {
			adjacency[i][west->index] = 1;
			temp_path[i][west->index] = 1;
		}
	}

	/* Power it up (squaring 3 times gives eighth power) */
	for (n = 0; n < 3; n++) {
		/* Square */
		for (i = 0; i < world->num_levels; i++) {
			for (j = 0; j < world->num_levels; j++) {
				lev_path[i][j] = 0;
				for (k = 0; k < world->num_levels; k++) {
					lev_path[i][j] += temp_path[i][k] * temp_path[k][j];
				}
			}
		}

		/* Copy it over for the next squaring or final multiply */
		for (i = 0; i < world->num_levels; i++) {
			for (j = 0; j < world->num_levels; j++) {
				temp_path[i][j] = lev_path[i][j];
			}
		}
	}

	/* Get the max of length 8 and length 9 paths */
	for (i = 0; i < world->num_levels; i++) {
		for (j = 0; j < world->num_levels; j++) {
			/* Multiply to get the length 9s */
			lev_path[i][j] = 0;
			for (k = 0; k < world->num_levels; k++) {
				lev_path[i][j] += temp_path[i][k] * adjacency[k][j];
			}

			/* Now replace by the length 8s if it's larger */
			if (lev_path[i][j] < temp_path[i][j]) {
				lev_path[i][j] = temp_path[i][j];
			}
		}
	}

	/* We now have the maximum of the number of paths of length 8 and the
	 * number of paths of length 9 (we need to try odd and even length paths,
	 * as using just one leads to anomalies) from any level to any other,
	 * which we will use as a basis for the racial probability table for
	 * racially based monsters in any given level.  For a level, we give
	 * every race a 1, then add the number of paths of length 8 from their
	 * hometown to that level.  We then turn every row entry into the
	 * cumulative total of the row to that point.  Whenever a racially based
	 * monster is called for, we will take a random integer less than the
	 * last entry of the row for that level, and proceed along the row,
	 * allocating the race corresponding to the position where we first
	 * exceed that integer.
	 */
	for (i = 0; i < world->num_levels; i++) {
		int prob = 0;
		struct player_race *p_race = races;
		while (p_race) {
			int hometown = 	strstr(world->name, "Dungeon") ? 1 :
				level_by_name(world, p_race->hometown)->index;
			/* Enter the cumulative probability */
			prob += 1 + lev_path[world->levels[hometown].index][i];
			race_prob[p_race->ridx][i] = prob;
			p_race = p_race->next;
		}
	}

	/* Free the temporary arrays */
	for (i = 0; i < world->num_levels; i++) {
		mem_free(temp_path[i]);
		mem_free(adjacency[i]);
		mem_free(lev_path[i]);
	}
	mem_free(temp_path);
	mem_free(adjacency);
	mem_free(lev_path);
}